

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

void __thiscall IsoWriter::writePrimaryVolumeDescriptor(IsoWriter *this)

{
  ByteFileWriter *this_00;
  uint32_t tagLocation;
  char *pcVar1;
  size_t __n;
  allocator<char> local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  string volumeSetIdentifier;
  string local_70;
  undefined1 local_50 [8];
  string volId;
  ByteFileWriter writer;
  IsoWriter *this_local;
  
  memset(this->m_buffer,0,0x800);
  this_00 = (ByteFileWriter *)(&volId.field_2._M_allocated_capacity + 1);
  ByteFileWriter::ByteFileWriter(this_00);
  ByteFileWriter::setBuffer(this_00,this->m_buffer,0x800);
  tagLocation = absoluteSectorNum(this);
  ByteFileWriter::writeDescriptorTag(this_00,PrimVol,tagLocation);
  ByteFileWriter::writeLE32(this_00,0);
  ByteFileWriter::writeLE32(this_00,0);
  ByteFileWriter::writeDString(this_00,&this->m_volumeLabel,0x20);
  ByteFileWriter::writeLE16(this_00,1);
  ByteFileWriter::writeLE16(this_00,1);
  ByteFileWriter::writeLE16(this_00,2);
  ByteFileWriter::writeLE16(this_00,2);
  ByteFileWriter::writeLE32(this_00,1);
  ByteFileWriter::writeLE32(this_00,1);
  int32uToHex_abi_cxx11_(&local_70,&this->m_volumeId);
  strToUpperCase((string *)local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  __n = 0x30;
  strPadLeft((string *)((long)&volumeSetIdentifier.field_2 + 8),(string *)local_50,8,'0');
  std::__cxx11::string::operator=
            ((string *)local_50,(string *)(volumeSetIdentifier.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(volumeSetIdentifier.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"        ",&local_101);
  std::operator+(&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 &local_100);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                 &local_e0,&this->m_volumeLabel);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  ByteFileWriter::writeDString((ByteFileWriter *)((long)&volId.field_2 + 8),pcVar1,0x80);
  this->m_buffer[200] = '\0';
  strcpy((char *)(this->m_buffer + 0xc9),"OSTA Compressed Unicode");
  this->m_buffer[0x108] = '\0';
  strcpy((char *)(this->m_buffer + 0x109),"OSTA Compressed Unicode");
  this->m_buffer[0x158] = '\0';
  pcVar1 = (char *)std::__cxx11::string::c_str();
  strcpy((char *)(this->m_buffer + 0x159),pcVar1);
  anon_unknown.dwarf_b4dde::writeTimestamp(this->m_buffer + 0x178,this->m_currentTime);
  this->m_buffer[0x184] = '\0';
  pcVar1 = (char *)std::__cxx11::string::c_str();
  strcpy((char *)(this->m_buffer + 0x185),pcVar1);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  strcpy((char *)(this->m_buffer + 0x1a4),pcVar1);
  this->m_buffer[0x1e8] = '\x01';
  anon_unknown.dwarf_b4dde::calcDescriptorCRC(this->m_buffer,0x200);
  File::write(&this->m_file,(int)this + 0xa0,(void *)0x800,__n);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void IsoWriter::writePrimaryVolumeDescriptor()
{
    memset(m_buffer, 0, sizeof(m_buffer));

    ByteFileWriter writer;
    writer.setBuffer(m_buffer, sizeof(m_buffer));
    writer.writeDescriptorTag(DescriptorTag::PrimVol, absoluteSectorNum());

    writer.writeLE32(0x00);  // Volume Descriptor Sequence Number
    writer.writeLE32(0x00);  // Primary Volume Descriptor Number
    writer.writeDString(m_volumeLabel, 32);

    writer.writeLE16(0x01);  // Volume Sequence Number
    writer.writeLE16(0x01);  // Maximum Volume Sequence Number
    writer.writeLE16(0x02);  // Interchange Level
    writer.writeLE16(0x02);  // Maximum Interchange Level
    writer.writeLE32(0x01);  // Character Set List
    writer.writeLE32(0x01);  // Maximum Character Set List

    std::string volId = strToUpperCase(int32uToHex(m_volumeId));
    volId = strPadLeft(volId, 8, '0');
    const std::string volumeSetIdentifier = volId + std::string("        ") + m_volumeLabel;
    writer.writeDString(volumeSetIdentifier.c_str(), 128);

    // Descriptor Character Set
    m_buffer[200] = 0x00;  // CS0 coded character set
    strcpy(reinterpret_cast<char *>(m_buffer) + 201, "OSTA Compressed Unicode");

    // Explanatory Character Set
    m_buffer[264] = 0x00;  // CS0 coded character set
    strcpy(reinterpret_cast<char *>(m_buffer) + 265, "OSTA Compressed Unicode");

    // skip Volume Abstract
    // skip Volume Copyright Notice

    // Application Identifier
    m_buffer[344] = 0x00;  // CS0 coded character set
    strcpy(reinterpret_cast<char *>(m_buffer) + 345, m_appId.c_str());

    writeTimestamp(m_buffer + 376, m_currentTime);  // timestamp

    // Implementation Identifier
    m_buffer[388] = 0x00;  // CS0 coded character set
    strcpy(reinterpret_cast<char *>(m_buffer) + 389, m_impId.c_str());

    strcpy(reinterpret_cast<char *>(m_buffer) + 420, m_appId.c_str());

    // skip Predecessor Volume Descriptor Sequence Location (BP 484) = 0L
    m_buffer[488] = 1;  // Flags (BP 488)

    // 490..511 Reserved

    calcDescriptorCRC(m_buffer, 512);
    m_file.write(m_buffer, SECTOR_SIZE);
}